

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O3

aspa_status
aspa_table_update_in_place
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation **failed_operation)

{
  aspa_record *record;
  aspa_update_operation *paVar1;
  aspa_array *paVar2;
  size_t __nmemb;
  uint32_t *__base;
  aspa_status aVar3;
  aspa_store_node *paVar4;
  aspa_record *paVar5;
  aspa_update_operation *paVar6;
  aspa_update_operation *paVar7;
  ulong uVar8;
  ulong index;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  aspa_array *a;
  aspa_array *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x268,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x269,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (failed_operation == (aspa_update_operation **)0x0) {
    __assert_fail("failed_operation",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x26a,
                  "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (count != 0 && operations != (aspa_update_operation *)0x0) {
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
    for (paVar4 = aspa_table->store; paVar4 != (aspa_store_node *)0x0; paVar4 = paVar4->next) {
      if (paVar4->rtr_socket == rtr_socket) goto LAB_0010d515;
    }
    local_40 = (aspa_array *)0x0;
    aVar3 = aspa_array_create(&local_40);
    paVar2 = local_40;
    if (aVar3 == ASPA_SUCCESS) {
      paVar4 = (aspa_store_node *)lrtr_malloc(0x18);
      if (paVar4 != (aspa_store_node *)0x0) {
        paVar4->rtr_socket = rtr_socket;
        paVar4->aspa_array = paVar2;
        paVar4->next = aspa_table->store;
        aspa_table->store = paVar4;
LAB_0010d515:
        paVar2 = paVar4->aspa_array;
        if (paVar2 == (aspa_array *)0x0) {
          __assert_fail("(*node)->aspa_array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x28b,
                        "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        aspa_array_reserve(paVar2,paVar2->size + count);
        index = 0;
        uVar8 = 0;
        do {
          paVar1 = operations + uVar8 + 1;
          paVar6 = (aspa_update_operation *)0x0;
          if (uVar8 < count - 1) {
            paVar6 = paVar1;
          }
          paVar7 = operations + uVar8;
          __nmemb = paVar1[-1].record.provider_count;
          if (paVar1[-1].type == ASPA_REMOVE) {
            if (__nmemb != 0) {
              __assert_fail("current->record.provider_count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x29a,
                            "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
            if ((paVar7->record).provider_asns != (uint32_t *)0x0) {
              __assert_fail("!current->record.provider_asns",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x29b,
                            "enum aspa_status aspa_table_update_in_place(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
          }
          else if ((__nmemb != 0) &&
                  (__base = (paVar7->record).provider_asns, __base != (uint32_t *)0x0)) {
            qsort(__base,__nmemb,4,compare_asns);
          }
          record = &paVar7->record;
          for (; index < paVar2->size; index = index + 1) {
            paVar5 = aspa_array_get_record(paVar2,index);
            if (record->customer_asn <= paVar5->customer_asn) break;
          }
          paVar5 = aspa_array_get_record(paVar2,index);
          if (paVar5 == (aspa_record *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = paVar5->customer_asn == record->customer_asn;
          }
          if (uVar8 < count - 1) {
            bVar10 = (paVar1->record).customer_asn == record->customer_asn;
          }
          else {
            bVar10 = false;
          }
          if (paVar7->type == ASPA_REMOVE) {
            if (bVar9) {
              (paVar7->record).provider_count = paVar5->provider_count;
              (paVar7->record).provider_asns = paVar5->provider_asns;
              aVar3 = aspa_array_remove(paVar2,index,false);
              if (aVar3 == ASPA_SUCCESS) goto LAB_0010d679;
            }
            *failed_operation = paVar7;
            pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
            aVar3 = ASPA_RECORD_NOT_FOUND;
            goto LAB_0010d71e;
          }
          if (paVar7->type == ASPA_ADD) {
            if (bVar9) {
              *failed_operation = paVar7;
              pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
              aVar3 = ASPA_DUPLICATE_RECORD;
              goto LAB_0010d71e;
            }
            if ((!bVar10) || (paVar6->type != ASPA_REMOVE)) {
              aVar3 = aspa_array_insert(paVar2,index,record,true);
              if (aVar3 == ASPA_SUCCESS) goto LAB_0010d679;
              *failed_operation = paVar7;
              goto LAB_0010d710;
            }
            paVar7->is_no_op = true;
            paVar6->is_no_op = true;
            uVar8 = uVar8 + 2;
          }
          else {
LAB_0010d679:
            uVar8 = uVar8 + 1;
            aspa_table_notify_clients(aspa_table,record,rtr_socket,paVar7->type);
          }
        } while (uVar8 < count);
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        aVar3 = ASPA_SUCCESS;
        goto LAB_0010d71e;
      }
      aspa_array_free(local_40,false);
LAB_0010d710:
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
    aVar3 = ASPA_ERROR;
  }
  else {
    aVar3 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
  }
LAB_0010d71e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return aVar3;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_table_update_in_place(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
					    struct aspa_update_operation *operations, size_t count,
					    struct aspa_update_operation **failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(failed_operation);

	if (!aspa_table || !rtr_socket || !failed_operation || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_wrlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	struct aspa_array *array = (*node)->aspa_array;
	size_t existing_i = 0;

	// preemptively allocating enough space
	aspa_array_reserve(array, count + array->size);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

#ifndef NDEBUG
		// Sanity check record
		if (current->type == ASPA_REMOVE) {
			assert(current->record.provider_count == 0);
			assert(!current->record.provider_asns);
		}
#endif

		// Sort providers.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		if (current->record.provider_count > 0 && current->record.provider_asns)
			qsort(current->record.provider_asns, current->record.provider_count, sizeof(uint32_t),
			      compare_asns);

		while (existing_i < array->size &&
		       aspa_array_get_record(array, existing_i)->customer_asn < current->record.customer_asn) {
			existing_i += 1;
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Handling 'add' operations
		if (current->type == ASPA_ADD) {
			// Attempt to add record with $CAS, but record with $CAS already exists
			// Error: Duplicate Add.
			if (existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_DUPLICATE_RECORD;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// Complete record's providers for clients
				next->record = current->record;
				aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
				aspa_table_notify_clients(aspa_table, &next->record, rtr_socket, next->type);
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Add record by appending it to new array (copy providers)
			if (aspa_array_insert(array, existing_i, &current->record, true) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_ERROR;
			}
		}

		// MARK: Handling 'remove' operations
		else if (current->type == ASPA_REMOVE) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}

			// If it's a remove operation, we insert a reference to the removed record's providers.
			current->record.provider_count = existing_record->provider_count;
			current->record.provider_asns = existing_record->provider_asns;

			// Remove record (don't release providers)
			if (aspa_array_remove(array, existing_i, false) != ASPA_SUCCESS) {
				*failed_operation = current;
				pthread_rwlock_unlock(&aspa_table->lock);
				return ASPA_RECORD_NOT_FOUND;
			}
		}

		// Notify clients
		aspa_table_notify_clients(aspa_table, &current->record, rtr_socket, current->type);
	}

	pthread_rwlock_unlock(&aspa_table->lock);
	return ASPA_SUCCESS;
}